

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmStateSnapshot * __thiscall
cmState::CreateInlineListFileSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  PositionType *this_00;
  pointer pcVar1;
  iterator it;
  PositionType PVar2;
  ReferenceType __src;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  iterator iVar6;
  PositionType pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  iterator local_1e0;
  undefined1 local_1d0 [208];
  SnapshotDataType local_100;
  
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  memcpy(local_1d0,__src,0xd0);
  memcpy(&local_100,local_1d0,0xd0);
  local_1e0 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
                        (&this->SnapshotData,it,&local_100);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pSVar3->SnapshotType = InlineListFileType;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pSVar3->Keep = true;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar6 = pSVar3->ExecutionListFile;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + fileName->_M_string_length);
  iVar6 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push_impl(&this->ExecutionListFiles,iVar6,&local_200);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pSVar3->ExecutionListFile = iVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->CurrentScope).Tree = local_1e0.Tree;
  (pBVar4->CurrentScope).Position = local_1e0.Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_1e0);
  PVar2 = (pSVar3->Policies).Position;
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = PVar2;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_1e0);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreateInlineListFileSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::InlineListFileType;
  pos->Keep = true;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->CurrentScope = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return { this, pos };
}